

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_test.c
# Opt level: O2

void CheckPut(void *ptr,char *k,size_t klen,char *v,size_t vlen)

{
  int iVar1;
  char *expected;
  char *expected_00;
  
  iVar1 = *ptr;
  if (1 < iVar1) {
    fprintf(_stderr,"%s:%d: %s: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
            0x53,phase,"*state < 2");
    abort();
  }
  if (iVar1 == 0) {
    expected_00 = "b";
    expected = "bar";
  }
  else {
    if (iVar1 != 1) goto LAB_00107fd6;
    expected_00 = "c";
    expected = "box";
  }
  CheckEqual(expected,k,klen);
  CheckEqual(expected_00,v,vlen);
LAB_00107fd6:
  *(int *)ptr = *ptr + 1;
  return;
}

Assistant:

static void CheckPut(void* ptr,
                     const char* k, size_t klen,
                     const char* v, size_t vlen) {
  int* state = (int*) ptr;
  CheckCondition(*state < 2);
  switch (*state) {
    case 0:
      CheckEqual("bar", k, klen);
      CheckEqual("b", v, vlen);
      break;
    case 1:
      CheckEqual("box", k, klen);
      CheckEqual("c", v, vlen);
      break;
  }
  (*state)++;
}